

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArcSineDifferentiationTest.cpp
# Opt level: O0

int main(int param_1,char **param_2)

{
  int __x;
  char *__lhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *extraout_XMM0_Qa;
  Variable x;
  undefined7 in_stack_ffffffffffffff38;
  undefined1 in_stack_ffffffffffffff3f;
  undefined1 uVar1;
  Variable *in_stack_ffffffffffffff40;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  string local_a8 [16];
  Variable *in_stack_ffffffffffffff68;
  string local_88 [8];
  Variable *in_stack_ffffffffffffff80;
  BaseExpression *in_stack_ffffffffffffff88;
  undefined1 local_50 [76];
  int local_4;
  
  local_4 = 0;
  Kandinsky::Variable::Variable((Variable *)0x1204d3);
  Kandinsky::Variable::setValue
            (in_stack_ffffffffffffff40,
             (double)CONCAT17(in_stack_ffffffffffffff3f,in_stack_ffffffffffffff38));
  Kandinsky::asin<Kandinsky::Variable,_nullptr>(in_stack_ffffffffffffff68);
  Kandinsky::BaseExpression::differentiate(in_stack_ffffffffffffff88,in_stack_ffffffffffffff80);
  __x = (int)local_50;
  __lhs = (char *)Kandinsky::Expression::evaluate((Expression *)0x12051e);
  sqrt(0.75);
  std::abs(__x);
  uVar1 = (double)extraout_XMM0_Qa < 0.0001;
  __rhs = extraout_XMM0_Qa;
  sqrt(0.75);
  std::__cxx11::to_string((double)__lhs);
  std::operator+(__lhs,__rhs);
  Kandinsky::assertOrExit
            (SUB81((ulong)__rhs >> 0x38,0),(string *)CONCAT17(uVar1,in_stack_ffffffffffffff38));
  std::__cxx11::string::~string(local_88);
  std::__cxx11::string::~string(local_a8);
  Kandinsky::Expression::~Expression((Expression *)0x1205e6);
  Kandinsky::ArcSineExpression::~ArcSineExpression((ArcSineExpression *)0x1205f0);
  local_4 = 0;
  Kandinsky::Variable::~Variable((Variable *)0x120608);
  return local_4;
}

Assistant:

int main (int /*argc*/, char** /*argv*/)
{
    Variable x;
    x.setValue(0.5);
    assertOrExit(std::abs((asin(x)).differentiate(x).evaluate() - 1. /  std::sqrt(1. - 0.5 * 0.5)) < 1.e-4, "x = 0.5; d(asin(x))/dx != " + std::to_string(1. / std::sqrt(1. - 0.5 * 0.5)));
    return 0;
}